

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,char *parameters,
               char *strict_function,char *verify_function,Formatter *format)

{
  byte bVar1;
  Utf8CheckMode UVar2;
  byte in_DL;
  FieldDescriptor *in_RDI;
  Formatter *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  char *in_stack_00000078;
  Formatter *in_stack_00000080;
  char **in_stack_000000a0;
  char *in_stack_000000a8;
  Formatter *in_stack_000000b0;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  
  bVar1 = in_DL & 1;
  UVar2 = GetUtf8CheckMode(in_stack_ffffffffffffffb8,(Options *)0x436269);
  if (UVar2 == STRICT) {
    if (bVar1 != 0) {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    Formatter::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    Formatter::Indent((Formatter *)0x4362ce);
    Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    if (bVar1 == 0) {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    else {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    FieldDescriptor::full_name_abi_cxx11_(in_RDI);
    Formatter::operator()(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    if (bVar1 != 0) {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    Formatter::Outdent((Formatter *)0x436363);
  }
  else if (UVar2 == VERIFY) {
    Formatter::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    Formatter::Indent((Formatter *)0x436388);
    Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    if (bVar1 == 0) {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    else {
      Formatter::operator()<>(unaff_retaddr,(char *)in_RDI);
    }
    FieldDescriptor::full_name_abi_cxx11_(in_RDI);
    Formatter::operator()(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    Formatter::Outdent((Formatter *)0x4363f2);
  }
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  const Formatter& format) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT: {
      if (for_parse) {
        format("DO_(");
      }
      format("::$proto_ns$::internal::WireFormatLite::$1$(\n", strict_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      }
      format("\"$1$\")", field->full_name());
      if (for_parse) {
        format(")");
      }
      format(";\n");
      format.Outdent();
      break;
    }
    case VERIFY: {
      format("::$proto_ns$::internal::WireFormat::$1$(\n", verify_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormat::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormat::SERIALIZE,\n");
      }
      format("\"$1$\");\n", field->full_name());
      format.Outdent();
      break;
    }
    case NONE:
      break;
  }
}